

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O0

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectLowerSet<true>
          (MultiIndexSet *__return_storage_ptr__,ProperWeights *weights,
          function<int_(int)> *rule_exactness,int normalized_offset,
          vector<int,_std::allocator<int>_> *level_limits)

{
  pointer pvVar1;
  int offset;
  anon_class_32_4_3c4e16dd local_1c0;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_1a0;
  double local_180;
  double noff_1;
  undefined1 local_158 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  cache_2;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_120;
  double local_100;
  double noff;
  undefined1 local_d8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  cache_1;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_a0;
  undefined1 local_70 [40];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  cache;
  size_t num_dimensions;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int normalized_offset_local;
  function<int_(int)> *rule_exactness_local;
  ProperWeights *weights_local;
  
  offset = (int)level_limits;
  cache.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)ProperWeights::getNumDimensions(weights);
  if (weights->contour == type_level) {
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)local_70,(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<int,(TasGrid::TypeDepth)1,false>
              ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(local_70 + 0x20),(MultiIndexManipulations *)weights,(ProperWeights *)local_70,
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    ::std::function<int_(int)>::~function((function<int_(int)> *)local_70);
    pvVar1 = cache.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cache_1.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&cache.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
    function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_1_,void>
              ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_a0,
               (anon_class_32_4_84b70047 *)
               &cache_1.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)pvVar1,&local_a0);
    ::std::function<bool_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_a0);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(local_70 + 0x20));
  }
  else if (weights->contour == type_curved) {
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)&noff,(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)2,false>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_d8,(MultiIndexManipulations *)weights,(ProperWeights *)&noff,
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    ::std::function<int_(int)>::~function((function<int_(int)> *)&noff);
    pvVar1 = cache.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_100 = (double)normalized_offset;
    cache_2.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&cache.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
    function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_2_,void>
              ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_120,
               (anon_class_32_4_3c4e16dd *)
               &cache_2.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)pvVar1,&local_120);
    ::std::function<bool_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_120);
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_d8);
  }
  else {
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)&noff_1,(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)3,false>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_158,(MultiIndexManipulations *)weights,(ProperWeights *)&noff_1,
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    ::std::function<int_(int)>::~function((function<int_(int)> *)&noff_1);
    pvVar1 = cache.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_180 = (double)normalized_offset;
    local_1c0.num_dimensions =
         (size_t *)
         &cache.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c0.cache =
         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)local_158;
    local_1c0.noff = &local_180;
    local_1c0.level_limits = level_limits;
    ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
    function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_3_,void>
              ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_1a0,&local_1c0);
    generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)pvVar1,&local_1a0);
    ::std::function<bool_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_1a0);
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet selectLowerSet(ProperWeights const &weights, std::function<int(int i)> rule_exactness,
                             int normalized_offset, std::vector<int> const &level_limits){
    size_t num_dimensions = weights.getNumDimensions();
    if (weights.contour == type_level){
        auto cache = generateLevelWeightsCache<int, type_level, false>(weights, rule_exactness, normalized_offset);
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (getIndexWeight<int, type_level>(index.data(), cache) <= normalized_offset);
                });
    }else if (weights.contour == type_curved){
        auto cache = generateLevelWeightsCache<double, type_curved, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_curved>(index.data(), cache)) <= noff);
                });
    }else{ // type_hyperbolic
        auto cache = generateLevelWeightsCache<double, type_hyperbolic, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_hyperbolic>(index.data(), cache)) <= noff);
                });
    }
}